

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execBcc<(moira::Instr)19,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 pc;
  uint addr;
  AEStackFrame frame;
  
  (*this->_vptr_Moira[0x19])(this,2);
  if (((this->reg).sr.n == (this->reg).sr.v) && (((this->reg).sr.z & 1U) == 0)) {
    pc = (this->reg).pc;
    addr = (int)(short)(this->queue).irc + pc;
    if ((addr & 1) == 0) {
      (this->reg).pc = addr;
      fullPrefetch<4ul,0>(this);
      return;
    }
    frame = makeFrame<0ul>(this,addr,pc);
    execAddressError(this,frame,0);
    return;
  }
  (*this->_vptr_Moira[0x19])(this,2);
  readExt(this);
  prefetch<4ul>(this);
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    sync(2);
    if (cond<I>()) {

        u32 newpc = reg.pc + (S == Word ? (i16)queue.irc : (i8)opcode);
        
        // Check for address error
        if (misaligned<Word>(newpc)) {
            execAddressError(makeFrame(newpc, reg.pc));
            return;
        }
                
        // Take branch
        reg.pc = newpc;
        fullPrefetch<POLLIPL>();

    } else {

        // Fall through to next instruction
        sync(2);
        if (S == Word) readExt();
        prefetch<POLLIPL>();
    }
}